

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ratectrl.c
# Opt level: O3

void set_baseline_gf_interval(AV1_COMP *cpi,FRAME_TYPE frame_type)

{
  int iVar1;
  AV1_PRIMARY *pAVar2;
  LAYER_CONTEXT *pLVar3;
  int iVar4;
  int iVar5;
  uint uVar6;
  long lVar7;
  
  pAVar2 = cpi->ppi;
  uVar6 = 10;
  if (((cpi->oxcf).q_cfg.aq_mode == '\x03') &&
     (uVar6 = cpi->cyclic_refresh->percent_refresh, (int)uVar6 < 1)) {
    iVar4 = 0x50;
  }
  else {
    iVar4 = (int)(100 / (ulong)uVar6) *
            *(int *)(&DAT_004ffc48 + (long)(cpi->sf).rt_sf.gf_length_lvl * 4);
    if (0x9f < iVar4) {
      iVar4 = 0xa0;
    }
  }
  iVar1 = (cpi->rc).avg_frame_low_motion;
  iVar5 = 0x10;
  if (0x27 < iVar1) {
    iVar5 = iVar4;
  }
  if (iVar1 == 0) {
    iVar5 = iVar4;
  }
  (pAVar2->p_rc).baseline_gf_interval = iVar5;
  iVar4 = (cpi->rc).frames_to_key;
  if ((iVar4 < iVar5) && ((cpi->oxcf).kf_cfg.auto_key == true)) {
    (pAVar2->p_rc).baseline_gf_interval = iVar4;
    (pAVar2->p_rc).gfu_boost = 2000;
    iVar5 = iVar4;
  }
  else {
    (pAVar2->p_rc).gfu_boost = 2000;
    uVar6 = 0;
    if (iVar5 < iVar4) goto LAB_0020447f;
  }
  uVar6 = (uint)(cpi->oxcf).kf_cfg.auto_key;
LAB_0020447f:
  (pAVar2->p_rc).constrained_gf_group = uVar6;
  (cpi->rc).frames_till_gf_update_due = iVar5;
  cpi->gf_frame_index = '\0';
  if (pAVar2->use_svc != 0) {
    (pAVar2->p_rc).baseline_gf_interval = 0xf9;
    (pAVar2->p_rc).constrained_gf_group = 0;
    (pAVar2->p_rc).gfu_boost = 1;
    (cpi->rc).frames_till_gf_update_due = 0xf9;
    uVar6 = (cpi->svc).number_temporal_layers * (cpi->svc).number_spatial_layers;
    iVar5 = 0xf9;
    if (0 < (int)uVar6) {
      pLVar3 = (cpi->svc).layer_context;
      lVar7 = 0;
      do {
        *(undefined8 *)((long)(pLVar3->p_rc).avg_frame_qindex + lVar7 + -0x5c) = 0xf9;
        *(undefined4 *)((long)(pLVar3->p_rc).gf_intervals + lVar7 + -4) = 1;
        *(undefined4 *)((long)&(pLVar3->rc).frames_till_gf_update_due + lVar7) = 0xf9;
        (&pLVar3->group_index)[lVar7] = '\0';
        lVar7 = lVar7 + 0x3380;
      } while ((ulong)uVar6 * 0x3380 - lVar7 != 0);
    }
  }
  (pAVar2->gf_group).size = iVar5;
  (pAVar2->gf_group).update_type[0] = (frame_type != '\0') * '\x02';
  (pAVar2->gf_group).refbuf_state[cpi->gf_frame_index] = frame_type != '\0';
  return;
}

Assistant:

static void set_baseline_gf_interval(AV1_COMP *cpi, FRAME_TYPE frame_type) {
  RATE_CONTROL *const rc = &cpi->rc;
  PRIMARY_RATE_CONTROL *const p_rc = &cpi->ppi->p_rc;
  GF_GROUP *const gf_group = &cpi->ppi->gf_group;

  set_golden_update(cpi);

  if (p_rc->baseline_gf_interval > rc->frames_to_key &&
      cpi->oxcf.kf_cfg.auto_key)
    p_rc->baseline_gf_interval = rc->frames_to_key;
  p_rc->gfu_boost = DEFAULT_GF_BOOST_RT;
  p_rc->constrained_gf_group =
      (p_rc->baseline_gf_interval >= rc->frames_to_key &&
       cpi->oxcf.kf_cfg.auto_key)
          ? 1
          : 0;
  rc->frames_till_gf_update_due = p_rc->baseline_gf_interval;
  cpi->gf_frame_index = 0;
  // SVC does not use GF as periodic boost.
  // TODO(marpan): Find better way to disable this for SVC.
  if (cpi->ppi->use_svc) {
    SVC *const svc = &cpi->svc;
    p_rc->baseline_gf_interval = MAX_STATIC_GF_GROUP_LENGTH - 1;
    p_rc->gfu_boost = 1;
    p_rc->constrained_gf_group = 0;
    rc->frames_till_gf_update_due = p_rc->baseline_gf_interval;
    for (int layer = 0;
         layer < svc->number_spatial_layers * svc->number_temporal_layers;
         ++layer) {
      LAYER_CONTEXT *const lc = &svc->layer_context[layer];
      lc->p_rc.baseline_gf_interval = p_rc->baseline_gf_interval;
      lc->p_rc.gfu_boost = p_rc->gfu_boost;
      lc->p_rc.constrained_gf_group = p_rc->constrained_gf_group;
      lc->rc.frames_till_gf_update_due = rc->frames_till_gf_update_due;
      lc->group_index = 0;
    }
  }
  gf_group->size = p_rc->baseline_gf_interval;
  gf_group->update_type[0] = (frame_type == KEY_FRAME) ? KF_UPDATE : GF_UPDATE;
  gf_group->refbuf_state[cpi->gf_frame_index] =
      (frame_type == KEY_FRAME) ? REFBUF_RESET : REFBUF_UPDATE;
}